

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<char>::addAll<kj::StringPtr>(Vector<char> *this,StringPtr *container)

{
  char *begin;
  char *end;
  StringPtr *container_local;
  Vector<char> *this_local;
  
  begin = StringPtr::begin(container);
  end = StringPtr::end(container);
  addAll<char_const*>(this,begin,end);
  return;
}

Assistant:

inline void addAll(Container&& container) {
    addAll(container.begin(), container.end());
  }